

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

string * gbt_vb_name_abi_cxx11_(DeploymentPos pos)

{
  ushort in_SI;
  string *in_RDI;
  long in_FS_OFFSET;
  VBDeploymentInfo *vbinfo;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff80;
  string *psVar1;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __const_iterator in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (VersionBitsDeploymentInfo + in_SI);
  uVar2 = 0;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this_00->_M_dataplus)._M_p;
  psVar1 = in_RDI;
  std::allocator<char>::allocator();
  __c = (char)((ulong)psVar1 >> 0x38);
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  std::allocator<char>::~allocator(&local_9);
  if ((this_00->_M_string_length & 1) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_stack_ffffffffffffff80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (this,in_stack_ffffffffffffffb0,__c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static std::string gbt_vb_name(const Consensus::DeploymentPos pos) {
    const struct VBDeploymentInfo& vbinfo = VersionBitsDeploymentInfo[pos];
    std::string s = vbinfo.name;
    if (!vbinfo.gbt_force) {
        s.insert(s.begin(), '!');
    }
    return s;
}